

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

UINT8 Pulse_Stop(void *drvObj)

{
  DRV_PULSE *drv;
  void *drvObj_local;
  
  if (*(char *)((long)drvObj + 8) == '\x01') {
    *(undefined1 *)((long)drvObj + 8) = 2;
    OSThread_Join(*(OS_THREAD **)((long)drvObj + 0x30));
    OSThread_Deinit(*(OS_THREAD **)((long)drvObj + 0x30));
    *(undefined8 *)((long)drvObj + 0x30) = 0;
    free(*(void **)((long)drvObj + 0x28));
    *(undefined8 *)((long)drvObj + 0x28) = 0;
    pa_simple_free(*(undefined8 *)((long)drvObj + 0x48));
    *(undefined1 *)((long)drvObj + 8) = 0;
    drvObj_local._7_1_ = '\0';
  }
  else {
    drvObj_local._7_1_ = 0xd8;
  }
  return drvObj_local._7_1_;
}

Assistant:

UINT8 Pulse_Stop(void* drvObj)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	
	if (drv->devState != 1)
		return 0xD8;	// is already stopped (or stopping)
	
	drv->devState = 2;
	
	OSThread_Join(drv->hThread);
	OSThread_Deinit(drv->hThread);	drv->hThread = NULL;
	
	free(drv->bufSpace);
	drv->bufSpace = NULL;
	
	pa_simple_free(drv->hPulse);
	
	drv->devState = 0;
	
	return AERR_OK;
}